

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Int_t * Gia_SimAbsFind(Vec_Int_t *vValues,int Value)

{
  int iVar1;
  Vec_Int_t *p;
  int i;
  
  p = Vec_IntAlloc(100);
  for (i = 0; i < vValues->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vValues,i);
    if (iVar1 == Value) {
      Vec_IntPush(p,i);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_SimAbsFind( Vec_Int_t * vValues, int Value )
{
    Vec_Int_t * vSubset = Vec_IntAlloc( 100 ); int i, Entry;
    Vec_IntForEachEntry( vValues, Entry, i )
        if ( Entry == Value )
            Vec_IntPush( vSubset, i );
    return vSubset;
}